

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O1

bool __thiscall DataManager::ImportMeshFromFile(DataManager *this,string *filename)

{
  TriMesh *_mesh;
  PointsPropertyHandle *__src;
  bool bVar1;
  Options local_2c [2];
  Options opt;
  
  _mesh = &this->mesh_;
  local_2c[0].flags_ = 0;
  bVar1 = OpenMesh::IO::read_mesh<OpenMesh::TriMesh_ArrayKernelT<MyTraits>>
                    (_mesh,filename,local_2c,true);
  if (bVar1) {
    OpenMesh::PolyConnectivity::operator=((PolyConnectivity *)this,(PolyConnectivity *)_mesh);
    __src = &(this->mesh_).super_Mesh.
             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
             .
             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
             .points_;
    memcpy(&(this->original_mesh_).super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .points_,__src,0x84);
    OpenMesh::PolyConnectivity::operator=
              ((PolyConnectivity *)&this->noisy_mesh_,(PolyConnectivity *)_mesh);
    memcpy(&(this->noisy_mesh_).super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .points_,__src,0x84);
    OpenMesh::PolyConnectivity::operator=
              ((PolyConnectivity *)&this->denoised_mesh_,(PolyConnectivity *)_mesh);
    memcpy(&(this->denoised_mesh_).super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .points_,__src,0x84);
  }
  return bVar1;
}

Assistant:

bool DataManager::ImportMeshFromFile(std::string filename)
{
    if(!OpenMesh::IO::read_mesh(mesh_, filename))
        return false;
    else
    {
        original_mesh_ = mesh_;
        noisy_mesh_ = mesh_;
        denoised_mesh_ = mesh_;
        return true;
    }
}